

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlElementPtr xmlValidGetElemDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,int *extsubset)

{
  xmlChar *prefix;
  xmlElementPtr pxVar1;
  xmlChar *name;
  
  if ((elem == (xmlNodePtr)0x0 || (doc == (xmlDocPtr)0x0 || ctxt == (xmlValidCtxtPtr)0x0)) ||
     (name = elem->name, name == (xmlChar *)0x0)) {
LAB_00157231:
    pxVar1 = (xmlElementPtr)0x0;
  }
  else {
    if (extsubset != (int *)0x0) {
      *extsubset = 0;
    }
    if ((elem->ns == (xmlNs *)0x0) || (prefix = elem->ns->prefix, prefix == (xmlChar *)0x0)) {
LAB_001571f3:
      pxVar1 = xmlGetDtdQElementDesc(doc->intSubset,name,(xmlChar *)0x0);
      if (pxVar1 != (xmlElementPtr)0x0) {
        return pxVar1;
      }
      if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_00157231;
      pxVar1 = xmlGetDtdQElementDesc(doc->extSubset,elem->name,(xmlChar *)0x0);
      if (pxVar1 == (xmlElementPtr)0x0 || extsubset == (int *)0x0) {
        return pxVar1;
      }
    }
    else {
      pxVar1 = xmlGetDtdQElementDesc(doc->intSubset,name,prefix);
      if (pxVar1 != (xmlElementPtr)0x0) {
        return pxVar1;
      }
      name = elem->name;
      if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_001571f3;
      pxVar1 = xmlGetDtdQElementDesc(doc->extSubset,name,prefix);
      if ((extsubset == (int *)0x0) || (pxVar1 == (xmlElementPtr)0x0)) {
        if (pxVar1 != (xmlElementPtr)0x0) {
          return pxVar1;
        }
        name = elem->name;
        goto LAB_001571f3;
      }
    }
    *extsubset = 1;
  }
  return pxVar1;
}

Assistant:

static xmlElementPtr
xmlValidGetElemDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
	            xmlNodePtr elem, int *extsubset) {
    xmlElementPtr elemDecl = NULL;
    const xmlChar *prefix = NULL;

    if ((ctxt == NULL) || (doc == NULL) ||
        (elem == NULL) || (elem->name == NULL))
        return(NULL);
    if (extsubset != NULL)
	*extsubset = 0;

    /*
     * Fetch the declaration for the qualified name
     */
    if ((elem->ns != NULL) && (elem->ns->prefix != NULL))
	prefix = elem->ns->prefix;

    if (prefix != NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset,
		                         elem->name, prefix);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset,
		                             elem->name, prefix);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }

    /*
     * Fetch the declaration for the non qualified name
     * This is "non-strict" validation should be done on the
     * full QName but in that case being flexible makes sense.
     */
    if (elemDecl == NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset, elem->name, NULL);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset, elem->name, NULL);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }
    return(elemDecl);
}